

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int ConversionFile(path *source,path *destination,bool use_second_side)

{
  FormatType *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  char *__s;
  IDisk *new_disk;
  IDisk *new_disk_side_2;
  FormatType *format;
  path local_80;
  DiskBuilder disk_builder;
  
  DiskBuilder::DiskBuilder(&disk_builder);
  if ((destination->_M_pathname)._M_string_length == 0) {
    std::experimental::filesystem::v1::__cxx11::path::operator=(destination,source);
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[1],std::experimental::filesystem::v1::__cxx11::path>(&local_80,(char (*) [1])0x173a0b)
    ;
    std::experimental::filesystem::v1::__cxx11::path::replace_extension(destination,&local_80);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_80);
  }
  std::experimental::filesystem::v1::__cxx11::path::generic_string(&local_80._M_pathname,source);
  printf("Loading %s",local_80._M_pathname._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_80);
  std::experimental::filesystem::v1::__cxx11::path::string(&local_80._M_pathname,source);
  bVar2 = DiskBuilder::CanLoad(&disk_builder,local_80._M_pathname._M_dataplus._M_p,&format);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    new_disk = (IDisk *)0x0;
    std::experimental::filesystem::v1::__cxx11::path::string(&local_80._M_pathname,source);
    iVar3 = DiskBuilder::LoadDisk
                      (&disk_builder,local_80._M_pathname._M_dataplus._M_p,&new_disk,
                       (ILoadingProgress *)0x0);
    std::__cxx11::string::~string((string *)&local_80);
    if (iVar3 == 0) {
      printf(" ok - ");
      new_disk_side_2 = (IDisk *)0x0;
      if ((use_second_side) && (*second_side != '\0')) {
        bVar2 = DiskBuilder::CanLoad(&disk_builder,second_side,&format);
        if (bVar2) {
          iVar3 = DiskBuilder::LoadDisk
                            (&disk_builder,second_side,&new_disk_side_2,(ILoadingProgress *)0x0);
          if (iVar3 == 0) {
            printf(" ok - ");
            goto LAB_001379ce;
          }
          __s = " !! Error loading disk 2 !!";
        }
        else {
          __s = " !! Error loading disk 2 : Format unknown !!";
        }
      }
      else {
LAB_001379ce:
        iVar3 = (**format->_vptr_FormatType)();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"KRYOFLUX");
        iVar4 = (*new_disk->_vptr_IDisk[2])(new_disk,(ulong)face_to_convert);
        if (iVar4 - 1U < 3) {
          printf(&DAT_001728e4 + *(int *)(&DAT_001728e4 + (ulong)(iVar4 - 1U) * 4));
          if (new_disk_side_2 != (IDisk *)0x0) {
            (*new_disk->_vptr_IDisk[7])();
            if (new_disk_side_2 != (IDisk *)0x0) {
              (*new_disk_side_2->_vptr_IDisk[1])();
            }
          }
          pFVar1 = out_support;
          std::experimental::filesystem::v1::__cxx11::path::string
                    (&local_80._M_pathname,destination);
          (*pFVar1->_vptr_FormatType[9])(pFVar1,local_80._M_pathname._M_dataplus._M_p,new_disk,0);
          uVar5 = (uint)(iVar3 == 0);
          std::__cxx11::string::~string((string *)&local_80);
          printf("Saving %s \n",(new_disk->current_disk_path_)._M_dataplus._M_p);
          goto LAB_00137940;
        }
        __s = " !! Error selecting side";
      }
    }
    else {
      __s = " !! Error loading disk !!";
    }
  }
  else {
    __s = " !! Error loading disk : Format unknown !!";
  }
  puts(__s);
  uVar5 = 0xffffffff;
LAB_00137940:
  DiskBuilder::~DiskBuilder(&disk_builder);
  return uVar5;
}

Assistant:

int ConversionFile(fs::path& source, fs::path& destination, bool use_second_side)
{
   DiskBuilder disk_builder;
   int return_value = 0;

   ////////////////////////////////////
   // Destination
   if (destination.empty())
   {
      // take source, remove file spec
      destination = source;
      destination.replace_extension("");
   }

   printf("Loading %s", source.generic_string().c_str());

   FormatType* format;
   if (!disk_builder.CanLoad(source.string().c_str(), format) )
   {
      printf(" !! Error loading disk : Format unknown !!\n");
      return -1;
   }

   // Load the disk - todo : add progression 
   IDisk* new_disk = nullptr;
   if (disk_builder.LoadDisk(source.string().c_str(), new_disk, nullptr) != 0)
   {
      printf(" !! Error loading disk !!\n");
      return -1;
   }
   else
   {
      printf(" ok - ");
   }

   // Second side foring ?
   IDisk* new_disk_side_2 = nullptr;
   if (use_second_side && strlen(second_side) > 0)
   {
      if (!disk_builder.CanLoad(second_side, format))
      {
         printf(" !! Error loading disk 2 : Format unknown !!\n");
         return -1;
      }

      // Load the disk - todo : add progression 
      if (disk_builder.LoadDisk(second_side, new_disk_side_2, nullptr) != 0)
      {
         printf(" !! Error loading disk 2 !!\n");
         return -1;
      }
      else
      {
         printf(" ok - ");
      }
   }

   // raw ?
   if (strcmp(format->GetFormatName(), "KRYOFLUX") == 0)
   {
      return_value = 1;
   }

   // Filter side
   IDisk::FaceSelection pSide = new_disk->FilterSide(face_to_convert);
   switch (pSide)
   {
   case IDisk::FaceSelection::FACE_1: printf("Side 0 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_2: printf("Side 1 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_BOTH: printf("Both Sides are kept - ");
      break;
   default:
      printf(" !! Error selecting side\n");
      return -1;
   }

   // Combine the 2 dumps, if necessary
   if (new_disk_side_2 != nullptr)
   {
      // Combine both disk      
      new_disk->CombineWithDisk(new_disk_side_2);
      delete new_disk_side_2;
   }


   // Save with the correct format
   out_support->SaveDisk(destination.string().c_str(), new_disk);
   printf("Saving %s \n", new_disk->GetCurrentLoadedDisk());

   return return_value;
}